

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

int Ptex::v2_2::PtexUtils::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  void *pvVar1;
  int in_ECX;
  void *in_RDX;
  char *dptr;
  int iVar2;
  int in_R8D;
  int in_R9D;
  long lVar3;
  
  iVar2 = (int)src;
  if (in_ECX == in_R9D && iVar2 == in_R9D) {
    pvVar1 = memcpy(in_RDX,dst,(long)(iVar2 * in_R8D));
    return (int)pvVar1;
  }
  pvVar1 = (void *)(long)in_R9D;
  for (lVar3 = 0; in_R8D * iVar2 != lVar3; lVar3 = lVar3 + iVar2) {
    pvVar1 = memcpy(in_RDX,dst + lVar3,(size_t)(long)in_R9D);
    in_RDX = (void *)((long)in_RDX + (long)in_ECX);
  }
  return (int)pvVar1;
}

Assistant:

void copy(const void* src, int sstride, void* dst, int dstride,
          int vres, int rowlen)
{
    // regular non-tiled case
    if (sstride == rowlen && dstride == rowlen) {
        // packed case - copy in single block
        memcpy(dst, src, vres*rowlen);
    } else {
        // copy a row at a time
        const char* sptr = (const char*) src;
        char* dptr = (char*) dst;
        for (const char* end = sptr + vres*sstride; sptr != end;) {
            memcpy(dptr, sptr, rowlen);
            dptr += dstride;
            sptr += sstride;
        }
    }
}